

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O0

void __thiscall chatra::Lock::releaseIfExists(Lock *this,Reference ref)

{
  unordered_set<chatra::Reference,_std::hash<chatra::Reference>,_std::equal_to<chatra::Reference>,_std::allocator<chatra::Reference>_>
  *e;
  unordered_set<chatra::Reference,_std::hash<chatra::Reference>,_std::equal_to<chatra::Reference>,_std::allocator<chatra::Reference>_>
  *__end1;
  unordered_set<chatra::Reference,_std::hash<chatra::Reference>,_std::equal_to<chatra::Reference>,_std::allocator<chatra::Reference>_>
  *__begin1;
  unordered_set<chatra::Reference,_std::hash<chatra::Reference>,_std::equal_to<chatra::Reference>,_std::allocator<chatra::Reference>_>
  (*__range1) [3];
  Lock *this_local;
  Reference ref_local;
  
  this_local = (Lock *)ref.node;
  for (__end1 = this->refs;
      __end1 != (unordered_set<chatra::Reference,_std::hash<chatra::Reference>,_std::equal_to<chatra::Reference>,_std::allocator<chatra::Reference>_>
                 *)&this->methodCall; __end1 = __end1 + 1) {
    std::
    unordered_set<chatra::Reference,_std::hash<chatra::Reference>,_std::equal_to<chatra::Reference>,_std::allocator<chatra::Reference>_>
    ::erase(__end1,(key_type *)&this_local);
  }
  return;
}

Assistant:

void Lock::releaseIfExists(Reference ref) {
	chatra_assert(!methodCall);
	CHATRA_DEBUG_LOCK_AUDIT;
	CHATRA_DEBUG_LOCK_LOG0("releaseIfExists");

#ifdef CHATRA_DEBUG_LOCK
	auto requester = ref.lockedBy();
	if (requester == InvalidRequester) {
		for (auto& e : refs)
			chatra_assert(e.count(ref) == 0);
		return;
	}
	chatra_assert(ref.lockedBy() == thread->getId());
	if (methodCall && refs[static_cast<size_t>(LockType::Temporary)].count(ref) != 0)
		return;
	size_t count = 0;
	for (auto& e : refs)
		count += e.erase(ref);
	chatra_assert(count <= 1);
	if (count != 0)
		ref.unlock();
#else
	for (auto& e : refs)
		e.erase(ref);
	// Omitted ref.unlock() for performance reason
#endif
}